

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ComputeShaderGeneratedCase::
genComputeSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool computeCmd,bool computeData,
          bool computeIndices)

{
  ostream *poVar1;
  char *pcVar2;
  byte local_1cd;
  uint local_1cc;
  ostringstream local_1a0 [8];
  ostringstream buf;
  int indexLayoutBinding;
  int dataLayoutBinding;
  int cmdLayoutBinding;
  bool computeIndices_local;
  bool computeData_local;
  bool computeCmd_local;
  ComputeShaderGeneratedCase *this_local;
  
  if ((computeCmd) && (computeData)) {
    local_1cc = 2;
  }
  else {
    local_1cd = 1;
    if (!computeCmd) {
      local_1cd = computeData;
    }
    local_1cc = (uint)((local_1cd & 1) != 0);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"#version 310 es\n\n");
  poVar1 = std::operator<<(poVar1,"precision highp int;\n");
  std::operator<<(poVar1,"precision highp float;\n\n");
  if ((computeCmd) && (*(int *)((long)this + 0x78) == 0)) {
    poVar1 = std::operator<<((ostream *)local_1a0,"struct DrawArraysIndirectCommand {\n");
    poVar1 = std::operator<<(poVar1,"    uint count;\n");
    poVar1 = std::operator<<(poVar1,"    uint primCount;\n");
    poVar1 = std::operator<<(poVar1,"    uint first;\n");
    poVar1 = std::operator<<(poVar1,"    uint reservedMustBeZero;\n");
    std::operator<<(poVar1,"};\n\n");
  }
  else if ((computeCmd) && (*(int *)((long)this + 0x78) == 1)) {
    poVar1 = std::operator<<((ostream *)local_1a0,"struct DrawElementsIndirectCommand {\n");
    poVar1 = std::operator<<(poVar1,"    uint count;\n");
    poVar1 = std::operator<<(poVar1,"    uint primCount;\n");
    poVar1 = std::operator<<(poVar1,"    uint firstIndex;\n");
    poVar1 = std::operator<<(poVar1,"    int  baseVertex;\n");
    poVar1 = std::operator<<(poVar1,"    uint reservedMustBeZero;\n");
    std::operator<<(poVar1,"};\n\n");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"layout(local_size_x = 1, local_size_y = 1) in;\n");
  std::operator<<(poVar1,"layout(std430) buffer;\n\n");
  if (computeCmd) {
    poVar1 = std::operator<<((ostream *)local_1a0,"layout(binding = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    poVar1 = std::operator<<(poVar1,") writeonly buffer CommandBuffer {\n");
    poVar1 = std::operator<<(poVar1,"    ");
    pcVar2 = "DrawElementsIndirectCommand";
    if (*(int *)((long)this + 0x78) == 0) {
      pcVar2 = "DrawArraysIndirectCommand";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1," commands[];\n");
    std::operator<<(poVar1,"};\n");
  }
  if (computeData) {
    poVar1 = std::operator<<((ostream *)local_1a0,"layout(binding = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)computeCmd);
    poVar1 = std::operator<<(poVar1,") writeonly buffer DataBuffer {\n");
    poVar1 = std::operator<<(poVar1,"    vec4 attribs[];\n");
    std::operator<<(poVar1,"};\n");
  }
  if (computeIndices) {
    poVar1 = std::operator<<((ostream *)local_1a0,"layout(binding = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1cc);
    poVar1 = std::operator<<(poVar1,") writeonly buffer IndexBuffer {\n");
    poVar1 = std::operator<<(poVar1,"    uint indices[];\n");
    std::operator<<(poVar1,"};\n");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"\n");
  poVar1 = std::operator<<(poVar1,"void main() {\n");
  poVar1 = std::operator<<(poVar1,"    const uint gridSize      = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x88));
  poVar1 = std::operator<<(poVar1,"u;\n");
  poVar1 = std::operator<<(poVar1,"    const uint triangleCount = gridSize * gridSize * 2u;\n");
  std::operator<<(poVar1,"\n");
  if (computeCmd) {
    poVar1 = std::operator<<((ostream *)local_1a0,"    // command\n");
    poVar1 = std::operator<<(poVar1,"    if (gl_GlobalInvocationID.x < ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x84));
    poVar1 = std::operator<<(poVar1,
                             "u && gl_GlobalInvocationID.y == 0u && gl_GlobalInvocationID.z == 0u) {\n"
                            );
    poVar1 = std::operator<<(poVar1,"        const uint numDrawCallTris = triangleCount / ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x84));
    poVar1 = std::operator<<(poVar1,"u;\n");
    poVar1 = std::operator<<(poVar1,
                             "        uint firstTri              = gl_GlobalInvocationID.x * numDrawCallTris;\n\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "        commands[gl_GlobalInvocationID.x].count                 = numDrawCallTris*3u;\n"
                            );
    std::operator<<(poVar1,"        commands[gl_GlobalInvocationID.x].primCount             = 1u;\n"
                   );
    if (*(int *)((long)this + 0x78) == 0) {
      std::operator<<((ostream *)local_1a0,
                      "        commands[gl_GlobalInvocationID.x].first                 = firstTri*3u;\n"
                     );
    }
    else if (*(int *)((long)this + 0x78) == 1) {
      std::operator<<((ostream *)local_1a0,
                      "        commands[gl_GlobalInvocationID.x].firstIndex            = firstTri*3u;\n"
                     );
      std::operator<<((ostream *)local_1a0,
                      "        commands[gl_GlobalInvocationID.x].baseVertex            = 0;\n");
    }
    poVar1 = std::operator<<((ostream *)local_1a0,
                             "        commands[gl_GlobalInvocationID.x].reservedMustBeZero    = 0u;\n"
                            );
    poVar1 = std::operator<<(poVar1,"    }\n");
    std::operator<<(poVar1,"\n");
  }
  if (computeData) {
    poVar1 = std::operator<<((ostream *)local_1a0,"    // vertex attribs\n");
    poVar1 = std::operator<<(poVar1,"    const vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
    std::operator<<(poVar1,"    const vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
    if (*(int *)((long)this + 0x78) == 0) {
      poVar1 = std::operator<<((ostream *)local_1a0,
                               "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
                              );
      poVar1 = std::operator<<(poVar1,"        uint        y           = gl_GlobalInvocationID.x;\n"
                              );
      poVar1 = std::operator<<(poVar1,"        uint        x           = gl_GlobalInvocationID.y;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n"
                              );
      poVar1 = std::operator<<(poVar1,"        const float cellSize    = 2.0 / float(gridSize);\n");
      poVar1 = std::operator<<(poVar1,
                               "        vec4        color       = ((x + y)%2u != 0u) ? (yellow) : (green);\n"
                              );
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 0u] = vec4(posX + cellSize, posY,            0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 0u] = vec4(posX,            posY + cellSize, 0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 1u] = color;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 1u] = color;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 1u] = color;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 1u] = color;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 1u] = color;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 1u] = color;\n"
                              );
      std::operator<<(poVar1,"    }\n");
    }
    else if (*(int *)((long)this + 0x78) == 1) {
      poVar1 = std::operator<<((ostream *)local_1a0,
                               "    if (gl_GlobalInvocationID.x < gridSize+1u && gl_GlobalInvocationID.y < gridSize+1u && gl_GlobalInvocationID.z == 0u) {\n"
                              );
      poVar1 = std::operator<<(poVar1,"        uint        y           = gl_GlobalInvocationID.x;\n"
                              );
      poVar1 = std::operator<<(poVar1,"        uint        x           = gl_GlobalInvocationID.y;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n"
                              );
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,
                               "        attribs[(y * (gridSize+1u) + x) * 4u + 0u] = vec4(posX, posY, 0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[(y * (gridSize+1u) + x) * 4u + 1u] = green;\n");
      poVar1 = std::operator<<(poVar1,
                               "        attribs[(y * (gridSize+1u) + x) * 4u + 2u] = vec4(posX, posY, 0.0, 1.0);\n"
                              );
      poVar1 = std::operator<<(poVar1,
                               "        attribs[(y * (gridSize+1u) + x) * 4u + 3u] = yellow;\n");
      std::operator<<(poVar1,"    }\n");
    }
    std::operator<<((ostream *)local_1a0,"\n");
  }
  if (computeIndices) {
    poVar1 = std::operator<<((ostream *)local_1a0,"    // indices\n");
    poVar1 = std::operator<<(poVar1,
                             "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
                            );
    poVar1 = std::operator<<(poVar1,"        uint    y       = gl_GlobalInvocationID.x;\n");
    poVar1 = std::operator<<(poVar1,"        uint    x       = gl_GlobalInvocationID.y;\n");
    poVar1 = std::operator<<(poVar1,"        uint    color   = ((x + y)%2u);\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,
                             "        indices[(y * gridSize + x) * 6u + 0u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "        indices[(y * gridSize + x) * 6u + 1u] = ((y+1u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "        indices[(y * gridSize + x) * 6u + 2u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "        indices[(y * gridSize + x) * 6u + 3u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "        indices[(y * gridSize + x) * 6u + 4u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "        indices[(y * gridSize + x) * 6u + 5u] = ((y+0u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
                            );
    poVar1 = std::operator<<(poVar1,"    }\n");
    std::operator<<(poVar1,"\n");
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ComputeShaderGeneratedCase::genComputeSource (bool computeCmd, bool computeData, bool computeIndices) const
{
	const int cmdLayoutBinding				= 0;
	const int dataLayoutBinding				= (computeCmd) ? (1) : (0);
	const int indexLayoutBinding			= (computeCmd && computeData) ? (2) : (computeCmd || computeData) ? (1) : (0);

	std::ostringstream buf;

	buf << "#version 310 es\n\n"
		<< "precision highp int;\n"
		<< "precision highp float;\n\n";

	if (computeCmd && m_drawMethod==DRAWMETHOD_DRAWARRAYS)
		buf	<< "struct DrawArraysIndirectCommand {\n"
			<< "    uint count;\n"
			<< "    uint primCount;\n"
			<< "    uint first;\n"
			<< "    uint reservedMustBeZero;\n"
			<< "};\n\n";
	else if (computeCmd && m_drawMethod==DRAWMETHOD_DRAWELEMENTS)
		buf	<< "struct DrawElementsIndirectCommand {\n"
			<< "    uint count;\n"
			<< "    uint primCount;\n"
			<< "    uint firstIndex;\n"
			<< "    int  baseVertex;\n"
			<< "    uint reservedMustBeZero;\n"
			<< "};\n\n";

	buf << "layout(local_size_x = 1, local_size_y = 1) in;\n"
		<< "layout(std430) buffer;\n\n";

	if (computeCmd)
		buf	<< "layout(binding = " << cmdLayoutBinding << ") writeonly buffer CommandBuffer {\n"
			<< "    " << ((m_drawMethod==DRAWMETHOD_DRAWARRAYS) ? ("DrawArraysIndirectCommand") : ("DrawElementsIndirectCommand")) << " commands[];\n"
			<< "};\n";
	if (computeData)
		buf	<< "layout(binding = " << dataLayoutBinding << ") writeonly buffer DataBuffer {\n"
			<< "    vec4 attribs[];\n"
			<< "};\n";
	if (computeIndices)
		buf	<< "layout(binding = " << indexLayoutBinding << ") writeonly buffer IndexBuffer {\n"
			<< "    uint indices[];\n"
			<< "};\n";

	buf	<< "\n"
		<< "void main() {\n"
		<< "    const uint gridSize      = " << m_gridSize << "u;\n"
		<< "    const uint triangleCount = gridSize * gridSize * 2u;\n"
		<< "\n";

	if (computeCmd)
	{
		buf	<< "    // command\n"
			<< "    if (gl_GlobalInvocationID.x < " << m_numDrawCmds << "u && gl_GlobalInvocationID.y == 0u && gl_GlobalInvocationID.z == 0u) {\n"
			<< "        const uint numDrawCallTris = triangleCount / " << m_numDrawCmds << "u;\n"
			<< "        uint firstTri              = gl_GlobalInvocationID.x * numDrawCallTris;\n\n"
			<< "        commands[gl_GlobalInvocationID.x].count                 = numDrawCallTris*3u;\n"
			<< "        commands[gl_GlobalInvocationID.x].primCount             = 1u;\n";

		if (m_drawMethod==DRAWMETHOD_DRAWARRAYS)
		{
			buf	<< "        commands[gl_GlobalInvocationID.x].first                 = firstTri*3u;\n";
		}
		else if (m_drawMethod==DRAWMETHOD_DRAWELEMENTS)
		{
			buf	<< "        commands[gl_GlobalInvocationID.x].firstIndex            = firstTri*3u;\n";
			buf	<< "        commands[gl_GlobalInvocationID.x].baseVertex            = 0;\n";
		}

		buf	<< "        commands[gl_GlobalInvocationID.x].reservedMustBeZero    = 0u;\n"
			<< "    }\n"
			<< "\n";
	}

	if (computeData)
	{
		buf	<< "    // vertex attribs\n"
			<< "    const vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
			<< "    const vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n";

		if (m_drawMethod == DRAWMETHOD_DRAWARRAYS)
		{
			buf	<< "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
				<< "        uint        y           = gl_GlobalInvocationID.x;\n"
				<< "        uint        x           = gl_GlobalInvocationID.y;\n"
				<< "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "        const float cellSize    = 2.0 / float(gridSize);\n"
				<< "        vec4        color       = ((x + y)%2u != 0u) ? (yellow) : (green);\n"
				<< "\n"
				<< "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 0u] = vec4(posX + cellSize, posY,            0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 0u] = vec4(posX,            posY,            0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 0u] = vec4(posX + cellSize, posY + cellSize, 0.0, 1.0);\n"
				<< "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 0u] = vec4(posX,            posY + cellSize, 0.0, 1.0);\n"
				<< "\n"
				<< "        attribs[((y * gridSize + x) * 6u + 0u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 1u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 2u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 3u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 4u) * 2u + 1u] = color;\n"
				<< "        attribs[((y * gridSize + x) * 6u + 5u) * 2u + 1u] = color;\n"
				<< "    }\n";
		}
		else if (m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		{
			buf	<< "    if (gl_GlobalInvocationID.x < gridSize+1u && gl_GlobalInvocationID.y < gridSize+1u && gl_GlobalInvocationID.z == 0u) {\n"
				<< "        uint        y           = gl_GlobalInvocationID.x;\n"
				<< "        uint        x           = gl_GlobalInvocationID.y;\n"
				<< "        float       posX        = (float(x) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "        float       posY        = (float(y) / float(gridSize)) * 2.0 - 1.0;\n"
				<< "\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 0u] = vec4(posX, posY, 0.0, 1.0);\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 1u] = green;\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 2u] = vec4(posX, posY, 0.0, 1.0);\n"
				<< "        attribs[(y * (gridSize+1u) + x) * 4u + 3u] = yellow;\n"
				<< "    }\n";
		}

		buf << "\n";
	}

	if (computeIndices)
	{
		buf	<< "    // indices\n"
			<< "    if (gl_GlobalInvocationID.x < gridSize && gl_GlobalInvocationID.y < gridSize && gl_GlobalInvocationID.z == 0u) {\n"
			<< "        uint    y       = gl_GlobalInvocationID.x;\n"
			<< "        uint    x       = gl_GlobalInvocationID.y;\n"
			<< "        uint    color   = ((x + y)%2u);\n"
			<< "\n"
			<< "        indices[(y * gridSize + x) * 6u + 0u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 1u] = ((y+1u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 2u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 3u] = ((y+0u) * (gridSize+1u) + (x+0u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 4u] = ((y+1u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
			<< "        indices[(y * gridSize + x) * 6u + 5u] = ((y+0u) * (gridSize+1u) + (x+1u)) * 2u + color;\n"
			<< "    }\n"
			<< "\n";
	}

	buf	<< "}\n";

	return buf.str();
}